

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void next_exaggerated_phase(Am_Object *interp)

{
  bool bVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint value;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *value_00;
  Am_Time duration;
  Am_Object subanimator;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Value_List values;
  Am_Value target;
  Am_Value value2;
  Am_Object_Method method;
  Am_Value value1;
  Am_Value curr_value;
  Am_Value local_80;
  Am_Value local_70;
  Am_Value local_60;
  Am_Value local_50;
  Am_Value local_40;
  Am_Value local_30;
  
  pAVar6 = Am_Object::Get(interp,0x111,0);
  value = Am_Value::operator_cast_to_int(pAVar6);
  Am_Object::Get_Object(&subanimator,(Am_Slot_Key)interp,0x108);
  pAVar6 = Am_Object::Get(&subanimator,0x169,0);
  Am_Value::Am_Value(&curr_value,pAVar6);
  pAVar6 = Am_Object::Get(interp,0x181,0);
  Am_Value::Am_Value(&value1,pAVar6);
  pAVar6 = Am_Object::Get(interp,0x182,0);
  Am_Value::Am_Value(&value2,pAVar6);
  bVar2 = Am_Value::Valid(&curr_value);
  if (!bVar2) {
    Am_Value::operator=(&curr_value,&value1);
  }
  Am_Time::Am_Time(&duration);
  target.type = 0;
  target.value.wrapper_value = (Am_Wrapper *)0x0;
  if (value == 0xfffffffe) {
    pAVar6 = Am_Object::Get(interp,0x10d,0);
    Am_Time::operator=(&duration,pAVar6);
    Am_Value::Am_Value(&local_30,&value1);
    pAVar6 = Am_Object::Get(interp,0x10c,0);
    Am_Value::Am_Value(&local_40,pAVar6);
    Am_Value::Am_Value(&local_50,&value2);
    add_offset((Am_Value *)&values,&local_30,(Direction)&local_40,(Am_Value *)0x0,1.0);
    Am_Value::operator=(&target,(Am_Value *)&values);
    Am_Value::~Am_Value((Am_Value *)&values);
    Am_Value::~Am_Value(&local_50);
    Am_Value::~Am_Value(&local_40);
    Am_Value::~Am_Value(&local_30);
    value = 0xffffffff;
  }
  else if (value == 0xffffffff) {
    pAVar6 = Am_Object::Get(interp,0xff,0);
    Am_Time::operator=(&duration,pAVar6);
    value = 0;
    Am_Value::operator=(&target,&value2);
  }
  else {
    pAVar6 = Am_Object::Get(interp,0x10e,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(interp,0xfa,0);
    Am_Value_List::Am_Value_List(&values,pAVar6);
    pAVar6 = Am_Object::Get(interp,0xfb,0);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    uVar3 = Am_Value_List::Length(&values);
    bVar1 = iVar5 + 1 < (int)(uVar3 - 1);
    bVar2 = iVar4 <= (int)value;
    if (bVar2 || bVar1) {
      Am_Object::Set(interp,0x169,&value2,0);
      Am_Object::Set(interp,0x111,-1,0);
      pAVar6 = Am_Object::Get(interp,200,0);
      Am_Object_Method::Am_Object_Method(&method,pAVar6);
      if (method.Call != (Am_Object_Method_Type *)0x0) {
        Am_Object::Am_Object(&local_e8,interp);
        (*method.Call)((Am_Object_Data *)&local_e8);
        Am_Object::~Am_Object(&local_e8);
      }
    }
    else {
      pAVar6 = Am_Object::Get(interp,0x110,0);
      Am_Time::operator=(&duration,pAVar6);
      Am_Value::Am_Value(&local_60,&value2);
      pAVar6 = Am_Object::Get(interp,0x10f,0);
      Am_Value::Am_Value(&local_70,pAVar6);
      Am_Value::Am_Value(&local_80,&value1);
      add_offset((Am_Value *)&method,&local_60,(Direction)&local_70,(Am_Value *)(ulong)(value & 1),
                 1.0 - (float)(int)value / (float)iVar4);
      Am_Value::operator=(&target,(Am_Value *)&method);
      Am_Value::~Am_Value((Am_Value *)&method);
      Am_Value::~Am_Value(&local_80);
      Am_Value::~Am_Value(&local_70);
      Am_Value::~Am_Value(&local_60);
      value = value + 1;
    }
    Am_Value_List::~Am_Value_List(&values);
    if (bVar2 || bVar1) goto LAB_001a6676;
  }
  Am_Object::Set(interp,0x111,value,0);
  value_00 = Am_Time::operator_cast_to_Am_Wrapper_(&duration);
  Am_Object::Set(&subanimator,0xfd,value_00,0);
  Am_Object::Am_Object(&local_f0,&subanimator);
  Am_Start_Animator(&local_f0,&curr_value,&target);
  Am_Object::~Am_Object(&local_f0);
LAB_001a6676:
  Am_Value::~Am_Value(&target);
  Am_Time::~Am_Time(&duration);
  Am_Value::~Am_Value(&value2);
  Am_Value::~Am_Value(&value1);
  Am_Value::~Am_Value(&curr_value);
  Am_Object::~Am_Object(&subanimator);
  return;
}

Assistant:

static void
next_exaggerated_phase(Am_Object interp)
{
  int curr_state = interp.Get(Am_EXAGGERATOR_STATE);
  Am_Object subanimator = interp.Get_Object(Am_SUB_ANIMATOR);
  Am_Value curr_value = subanimator.Get(Am_VALUE);
  Am_Value value1 = interp.Get(Am_VALUE_1);
  Am_Value value2 = interp.Get(Am_VALUE_2);
  if (!curr_value.Valid())
    curr_value = value1;

  Am_Time duration;
  Am_Value target;
  int next_state;

  switch (curr_state) {
  case Am_EXAGGERATOR_IDLE:
    //
    // enter WINDUP phase
    //
    duration = interp.Get(Am_WINDUP_DELAY);
    target = add_offset(value1, interp.Get(Am_WINDUP_AMOUNT), AWAYFROM, value2);
    next_state = Am_EXAGGERATOR_WINDUP;
    break;

  case Am_EXAGGERATOR_WINDUP:
    //
    // enter INTERPOLATING phase
    //
    duration = interp.Get(Am_CURRENT_DURATION);
    target = value2;
    next_state = Am_EXAGGERATOR_INTERPOLATING;
    break;

  case Am_EXAGGERATOR_INTERPOLATING:
  default: {
    //
    // enter WIGGLING phase
    //
    int wiggle_count = interp.Get(Am_WIGGLES);
    int which_wiggle = curr_state - Am_EXAGGERATOR_INTERPOLATING;

    // also check whether there are any values waiting to be visited
    // skip the wiggling if there are (we'll just wiggle on the last one)
    Am_Value_List values = interp.Get(Am_VALUES);
    int curr_phase = interp.Get(Am_CURRENT_PHASE);
    bool values_waiting = (curr_phase + 1 < ((int)values.Length()) - 1);

    if (!values_waiting && which_wiggle < wiggle_count) {
      duration = interp.Get(Am_WIGGLE_DELAY);

      float attenuation = 1 - ((float)which_wiggle) / wiggle_count;

      target = add_offset(value2, interp.Get(Am_WIGGLE_AMOUNT),
                          (which_wiggle & 1) ? TOWARDS : AWAYFROM, value1,
                          attenuation);
      next_state = curr_state + 1;
    } else {
      // call INTERIM_DO to get next segment of path (if any)
      // pretend we've just done a windup at value2, so that the next segment of the path won't include a windup
      interp.Set(Am_VALUE, value2);
      interp.Set(Am_EXAGGERATOR_STATE, Am_EXAGGERATOR_WINDUP);

      Am_Object_Method method = interp.Get(Am_INTERIM_DO_METHOD);
      if (method.Valid())
        method.Call(interp);
      return;
    }
  }
  }

  interp.Set(Am_EXAGGERATOR_STATE, next_state);

  // set up sub animator to do the actual animation
  subanimator.Set(Am_DURATION, duration);
  Am_Start_Animator(subanimator, curr_value, target);
}